

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiContextHook *pIVar4;
  _func_void_int_int *p_Var5;
  char *__s1;
  ImGuiWindow **ppIVar6;
  unsigned_short *puVar7;
  ImGuiContext *pIVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  ImGuiID key;
  ImGuiContext *g_1;
  ImGuiWindow *pIVar11;
  ImGuiViewport *pIVar12;
  ImGuiWindow **ppIVar13;
  unsigned_short *__dest;
  byte bVar14;
  uint uVar15;
  ImGuiContext *g_3;
  char *pcVar16;
  char *label;
  ImGuiContext *g;
  byte bVar17;
  int iVar18;
  ImGuiContext *g_2;
  ulong uVar19;
  int clip_dir;
  long lVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  ImVec2 IVar26;
  float fVar27;
  float fVar28;
  ImRect local_48;
  
  pIVar9 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1126,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->WithinFrameScope == false) {
    __assert_fail("g.WithinFrameScope && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x112b,"void ImGui::EndFrame()");
  }
  iVar18 = (GImGui->Hooks).Size;
  if (0 < iVar18) {
    lVar20 = 0;
    lVar21 = 0;
    do {
      pIVar4 = (pIVar9->Hooks).Data;
      if (*(int *)(pIVar4 + lVar20 + 4) == 2) {
        (**(code **)(pIVar4 + lVar20 + 0x10))(pIVar9,pIVar4 + lVar20);
        iVar18 = (pIVar9->Hooks).Size;
      }
      lVar21 = lVar21 + 1;
      lVar20 = lVar20 + 0x20;
    } while (lVar21 < iVar18);
  }
  bVar3 = (GImGui->IO).KeyCtrl;
  uVar15 = bVar3 + 2;
  if ((GImGui->IO).KeyShift == false) {
    uVar15 = (uint)bVar3;
  }
  uVar23 = uVar15 + 4;
  if ((GImGui->IO).KeyAlt == false) {
    uVar23 = uVar15;
  }
  uVar15 = uVar23 + 8;
  if ((GImGui->IO).KeySuper == false) {
    uVar15 = uVar23;
  }
  if ((uVar15 != 0) && ((GImGui->IO).KeyMods != uVar15)) {
    __assert_fail("(key_mod_flags == 0 || g.IO.KeyMods == key_mod_flags) && \"Mismatching io.KeyCtrl/io.KeyShift/io.KeyAlt/io.KeySuper vs io.KeyMods\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1c13,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  iVar18 = (GImGui->CurrentWindowStack).Size;
  if (iVar18 != 1) {
    if (1 < iVar18) {
      __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x1c1f,"void ImGui::ErrorCheckEndFrameSanityChecks()");
    }
    __assert_fail("(g.CurrentWindowStack.Size == 1) && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1c25,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  if ((GImGui->GroupStack).Size != 0) {
    __assert_fail("(g.GroupStack.Size == 0) && \"Missing EndGroup call!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x1c29,"void ImGui::ErrorCheckEndFrameSanityChecks()");
  }
  p_Var5 = (pIVar9->IO).ImeSetInputScreenPosFn;
  if (p_Var5 != (_func_void_int_int *)0x0) {
    fVar27 = (pIVar9->PlatformImeLastPos).x;
    if ((fVar27 != 3.4028235e+38) || (NAN(fVar27))) {
      fVar25 = (pIVar9->PlatformImePos).x;
      fVar24 = (pIVar9->PlatformImePos).y;
      fVar28 = (pIVar9->PlatformImeLastPos).y - fVar24;
      if ((fVar27 - fVar25) * (fVar27 - fVar25) + fVar28 * fVar28 <= 0.0001) goto LAB_00148c41;
    }
    else {
      fVar25 = (pIVar9->PlatformImePos).x;
      fVar24 = (pIVar9->PlatformImePos).y;
    }
    (*p_Var5)((int)fVar25,(int)fVar24);
    pIVar9->PlatformImeLastPos = pIVar9->PlatformImePos;
  }
LAB_00148c41:
  pIVar9->WithinFrameScopeWithImplicitWindow = false;
  pIVar11 = pIVar9->CurrentWindow;
  if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WriteAccessed == false)) {
    pIVar11->Active = false;
  }
  End();
  pIVar10 = GImGui;
  if ((GImGui->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15)) {
    if (GImGui->NavWindowingListWindow == (ImGuiWindow *)0x0) {
      key = ImHashStr("###NavWindowingList",0,0);
      pIVar11 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar10->WindowsById,key);
      pIVar10->NavWindowingListWindow = pIVar11;
    }
    pIVar12 = GetMainViewport();
    pIVar8 = GImGui;
    IVar2.y = (pIVar12->Size).y * 0.2;
    IVar2.x = (pIVar12->Size).x * 0.2;
    (GImGui->NextWindowData).SizeConstraintRect.Min = IVar2;
    (pIVar8->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
    (pIVar8->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
    (pIVar8->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
    (pIVar8->NextWindowData).SizeCallbackUserData = (void *)0x0;
    IVar26.x = (pIVar12->Size).x * 0.5 + (pIVar12->Pos).x;
    IVar26.y = (pIVar12->Size).y * 0.5 + (pIVar12->Pos).y;
    (pIVar8->NextWindowData).Flags = (pIVar8->NextWindowData).Flags | 0x11;
    (pIVar8->NextWindowData).PosVal = IVar26;
    (pIVar8->NextWindowData).PosPivotVal.x = 0.5;
    (pIVar8->NextWindowData).PosPivotVal.y = 0.5;
    (pIVar8->NextWindowData).PosCond = 1;
    IVar2 = (pIVar10->Style).WindowPadding;
    fVar27 = IVar2.x;
    fVar25 = IVar2.y;
    local_48.Min.y = fVar25 + fVar25;
    local_48.Min.x = fVar27 + fVar27;
    PushStyleVar(1,&local_48.Min);
    Begin("###NavWindowingList",(bool *)0x0,0xc1347);
    lVar20 = (long)(pIVar10->WindowsFocusOrder).Size;
    if (0 < lVar20) {
      do {
        if ((pIVar10->WindowsFocusOrder).Size < lVar20) goto LAB_001494d8;
        pIVar11 = (pIVar10->WindowsFocusOrder).Data[lVar20 + -1];
        if (pIVar11 == (ImGuiWindow *)0x0) {
          __assert_fail("window != __null",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                        ,0x2610,"void ImGui::NavUpdateWindowingOverlay()");
        }
        if (((pIVar11->WasActive == true) && (pIVar11->RootWindow == pIVar11)) &&
           (uVar15 = pIVar11->Flags, (uVar15 >> 0x13 & 1) == 0)) {
          __s1 = pIVar11->Name;
          pcVar16 = __s1;
          if (__s1 == (char *)0xffffffffffffffff) {
LAB_00148e13:
            label = "(Popup)";
            if ((uVar15 >> 0x1a & 1) == 0) {
              if ((uVar15 >> 10 & 1) != 0) {
                iVar18 = strcmp(__s1,"##MainMenuBar");
                label = "(Main menu bar)";
                if (iVar18 == 0) goto LAB_00148e44;
              }
              label = "(Untitled)";
            }
          }
          else {
            do {
              if (*pcVar16 == '#') {
                if (pcVar16[1] == '#') goto LAB_00148e09;
              }
              else if (*pcVar16 == '\0') goto LAB_00148e09;
              pcVar16 = pcVar16 + 1;
            } while (pcVar16 != (char *)0xffffffffffffffff);
            pcVar16 = (char *)0xffffffffffffffff;
LAB_00148e09:
            label = __s1;
            if (__s1 == pcVar16) goto LAB_00148e13;
          }
LAB_00148e44:
          local_48.Min.x = 0.0;
          local_48.Min.y = 0.0;
          Selectable(label,pIVar10->NavWindowingTarget == pIVar11,0,&local_48.Min);
        }
        bVar3 = 1 < lVar20;
        lVar20 = lVar20 + -1;
      } while (bVar3);
    }
    End();
    PopStyleVar(1);
  }
  pIVar11 = pIVar10->NavWrapRequestWindow;
  if (((((pIVar11 != (ImGuiWindow *)0x0) && (pIVar10->NavWindow == pIVar11)) &&
       ((GImGui->NavMoveRequest == true &&
        (((GImGui->NavMoveResultLocal).ID == 0 && ((GImGui->NavMoveResultOther).ID == 0)))))) &&
      (pIVar10->NavMoveRequestForward == ImGuiNavForward_None)) &&
     (pIVar10->NavLayer == ImGuiNavLayer_Main)) {
    uVar15 = pIVar10->NavWrapRequestFlags;
    if (uVar15 == 0) {
      __assert_fail("move_flags != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                    ,0x2507,"void ImGui::NavEndFrame()");
    }
    local_48.Min = pIVar11->NavRectRel[0].Min;
    local_48.Max = pIVar11->NavRectRel[0].Max;
    iVar18 = pIVar10->NavMoveDir;
    clip_dir = iVar18;
    if (iVar18 == 0) {
      if ((uVar15 & 5) == 0) goto LAB_00149128;
      fVar27 = (pIVar11->SizeFull).x;
      fVar25 = (pIVar11->WindowPadding).x;
      fVar25 = fVar25 + fVar25 + (pIVar11->ContentSize).x;
      uVar23 = -(uint)(fVar25 <= fVar27);
      fVar27 = (float)(uVar23 & (uint)fVar27 | ~uVar23 & (uint)fVar25) - (pIVar11->Scroll).x;
      clip_dir = 0;
      if ((uVar15 & 4) != 0) {
        fVar25 = local_48.Max.y - local_48.Min.y;
        local_48.Min.y = local_48.Min.y - fVar25;
        local_48.Max.y = local_48.Max.y - fVar25;
        clip_dir = 2;
      }
      local_48.Max.x = fVar27;
      local_48.Min.x = fVar27;
      NavMoveRequestForward(0,clip_dir,&local_48,uVar15);
      iVar18 = pIVar10->NavMoveDir;
    }
    if (iVar18 == 1 && (uVar15 & 5) != 0) {
      fVar27 = (pIVar11->Scroll).x;
      fVar24 = local_48.Max.y;
      local_48.Max = (ImVec2)(CONCAT44(local_48.Max.y,fVar27) ^ 0x80000000);
      fVar25 = local_48.Min.y;
      local_48.Min = (ImVec2)(CONCAT44(local_48.Min.y,fVar27) ^ 0x80000000);
      if ((uVar15 & 4) != 0) {
        fVar27 = fVar24 - fVar25;
        local_48.Min.y = fVar25 + fVar27;
        local_48.Max.y = fVar27 + fVar24;
        clip_dir = 3;
      }
      NavMoveRequestForward(1,clip_dir,&local_48,uVar15);
      iVar18 = pIVar10->NavMoveDir;
    }
    if ((uVar15 & 10) != 0 && iVar18 == 2) {
      fVar27 = (pIVar11->SizeFull).y;
      fVar25 = (pIVar11->WindowPadding).y;
      fVar25 = fVar25 + fVar25 + (pIVar11->ContentSize).y;
      uVar23 = -(uint)(fVar25 <= fVar27);
      fVar27 = (float)(uVar23 & (uint)fVar27 | ~uVar23 & (uint)fVar25) - (pIVar11->Scroll).y;
      if ((uVar15 & 8) != 0) {
        fVar25 = local_48.Max.x - local_48.Min.x;
        local_48.Min.x = local_48.Min.x - fVar25;
        local_48.Max.x = local_48.Max.x - fVar25;
        clip_dir = 0;
      }
      local_48.Max.y = fVar27;
      local_48.Min.y = fVar27;
      NavMoveRequestForward(2,clip_dir,&local_48,uVar15);
      iVar18 = pIVar10->NavMoveDir;
    }
    if (iVar18 == 3 && (uVar15 & 10) != 0) {
      fVar27 = (pIVar11->Scroll).y;
      fVar24 = local_48.Max.x;
      local_48.Max = (ImVec2)(CONCAT44(fVar27,local_48.Max.x) ^ 0x8000000000000000);
      fVar25 = local_48.Min.x;
      local_48.Min = (ImVec2)(CONCAT44(fVar27,local_48.Min.x) ^ 0x8000000000000000);
      if ((uVar15 & 8) != 0) {
        fVar27 = fVar24 - fVar25;
        local_48.Min.x = fVar25 + fVar27;
        local_48.Max.x = fVar27 + fVar24;
        clip_dir = 1;
      }
      NavMoveRequestForward(3,clip_dir,&local_48,uVar15);
    }
  }
LAB_00149128:
  bVar14 = pIVar9->DragDropActive;
  iVar18 = pIVar9->FrameCount;
  if ((bool)bVar14 != true) goto LAB_00149195;
  if ((pIVar9->DragDropPayload).DataFrameCount + 1 < iVar18) {
    if ((pIVar9->DragDropSourceFlags & 0x20) == 0) {
      if (4 < (ulong)(uint)pIVar9->DragDropMouseButton) {
        __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                      ,0x125f,"bool ImGui::IsMouseDown(ImGuiMouseButton)");
      }
      bVar17 = (GImGui->IO).MouseDown[(uint)pIVar9->DragDropMouseButton] ^ 1;
      goto LAB_0014917b;
    }
  }
  else {
    bVar17 = 0;
LAB_0014917b:
    if ((bVar17 == 0) && ((pIVar9->DragDropPayload).Delivery == false)) goto LAB_00149195;
  }
  ClearDragDrop();
  bVar14 = pIVar9->DragDropActive;
  iVar18 = pIVar9->FrameCount;
LAB_00149195:
  if ((((bVar14 & 1) != 0) && (pIVar9->DragDropSourceFrameCount < iVar18)) &&
     ((pIVar9->DragDropSourceFlags & 1) == 0)) {
    pIVar9->DragDropWithinSource = true;
    SetTooltip("...");
    pIVar9->DragDropWithinSource = false;
    iVar18 = pIVar9->FrameCount;
  }
  pIVar9->WithinFrameScope = false;
  pIVar9->FrameCountEnded = iVar18;
  UpdateMouseMovingWindowEndFrame();
  iVar18 = (pIVar9->WindowsTempSortBuffer).Capacity;
  if (iVar18 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    iVar18 = 0;
    ppIVar13 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar6 = (pIVar9->WindowsTempSortBuffer).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar13,ppIVar6,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
      ppIVar6 = (pIVar9->WindowsTempSortBuffer).Data;
      if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
    }
    (pIVar9->WindowsTempSortBuffer).Data = ppIVar13;
    (pIVar9->WindowsTempSortBuffer).Capacity = 0;
  }
  (pIVar9->WindowsTempSortBuffer).Size = 0;
  uVar15 = (pIVar9->Windows).Size;
  uVar22 = (ulong)uVar15;
  if (iVar18 < (int)uVar15) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar13 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar22 * 8,GImAllocatorUserData);
    ppIVar6 = (pIVar9->WindowsTempSortBuffer).Data;
    if (ppIVar6 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar13,ppIVar6,(long)(pIVar9->WindowsTempSortBuffer).Size << 3);
      ppIVar6 = (pIVar9->WindowsTempSortBuffer).Data;
      if ((ppIVar6 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar6,GImAllocatorUserData);
    }
    (pIVar9->WindowsTempSortBuffer).Data = ppIVar13;
    (pIVar9->WindowsTempSortBuffer).Capacity = uVar15;
    uVar22 = (ulong)(uint)(pIVar9->Windows).Size;
  }
  if ((int)uVar22 == 0) {
    iVar18 = 0;
  }
  else {
    uVar19 = 0;
    do {
      if ((long)(int)uVar22 <= (long)uVar19) {
LAB_001494d8:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                      ,0x68b,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar11 = (pIVar9->Windows).Data[uVar19];
      if ((pIVar11->Active != true) || ((pIVar11->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar9->WindowsTempSortBuffer,pIVar11);
        uVar22 = (ulong)(uint)(pIVar9->Windows).Size;
      }
      uVar19 = uVar19 + 1;
      iVar18 = (int)uVar22;
    } while (uVar19 != uVar22);
  }
  if (iVar18 == (pIVar9->WindowsTempSortBuffer).Size) {
    (pIVar9->Windows).Size = iVar18;
    iVar18 = (pIVar9->WindowsTempSortBuffer).Capacity;
    (pIVar9->WindowsTempSortBuffer).Capacity = (pIVar9->Windows).Capacity;
    (pIVar9->Windows).Capacity = iVar18;
    ppIVar6 = (pIVar9->WindowsTempSortBuffer).Data;
    (pIVar9->WindowsTempSortBuffer).Data = (pIVar9->Windows).Data;
    (pIVar9->Windows).Data = ppIVar6;
    (pIVar9->IO).MetricsActiveWindows = pIVar9->WindowsActiveCount;
    ((pIVar9->IO).Fonts)->Locked = false;
    (pIVar9->IO).MouseWheel = 0.0;
    (pIVar9->IO).MouseWheelH = 0.0;
    if ((pIVar9->IO).InputQueueCharacters.Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      puVar7 = (pIVar9->IO).InputQueueCharacters.Data;
      if (puVar7 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar7,(long)(pIVar9->IO).InputQueueCharacters.Size * 2);
        puVar7 = (pIVar9->IO).InputQueueCharacters.Data;
        if ((puVar7 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar7,GImAllocatorUserData);
      }
      (pIVar9->IO).InputQueueCharacters.Data = __dest;
      (pIVar9->IO).InputQueueCharacters.Capacity = 0;
    }
    (pIVar9->IO).InputQueueCharacters.Size = 0;
    (pIVar9->IO).NavInputs[0] = 0.0;
    (pIVar9->IO).NavInputs[1] = 0.0;
    (pIVar9->IO).NavInputs[2] = 0.0;
    (pIVar9->IO).NavInputs[3] = 0.0;
    (pIVar9->IO).NavInputs[4] = 0.0;
    (pIVar9->IO).NavInputs[5] = 0.0;
    (pIVar9->IO).NavInputs[6] = 0.0;
    (pIVar9->IO).NavInputs[7] = 0.0;
    (pIVar9->IO).NavInputs[8] = 0.0;
    (pIVar9->IO).NavInputs[9] = 0.0;
    (pIVar9->IO).NavInputs[10] = 0.0;
    (pIVar9->IO).NavInputs[0xb] = 0.0;
    (pIVar9->IO).NavInputs[0xc] = 0.0;
    (pIVar9->IO).NavInputs[0xd] = 0.0;
    (pIVar9->IO).NavInputs[0xe] = 0.0;
    (pIVar9->IO).NavInputs[0xf] = 0.0;
    (pIVar9->IO).NavInputs[0x10] = 0.0;
    (pIVar9->IO).NavInputs[0x11] = 0.0;
    (pIVar9->IO).NavInputs[0x12] = 0.0;
    (pIVar9->IO).NavInputs[0x13] = 0.0;
    (pIVar9->IO).NavInputs[0x14] = 0.0;
    iVar18 = (pIVar9->Hooks).Size;
    if (0 < iVar18) {
      lVar20 = 0;
      lVar21 = 0;
      do {
        pIVar4 = (pIVar9->Hooks).Data;
        if (*(int *)(pIVar4 + lVar20 + 4) == 3) {
          (**(code **)(pIVar4 + lVar20 + 0x10))(pIVar9,pIVar4 + lVar20);
          iVar18 = (pIVar9->Hooks).Size;
        }
        lVar21 = lVar21 + 1;
        lVar20 = lVar20 + 0x20;
      } while (lVar21 < iVar18);
    }
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsTempSortBuffer.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                ,0x1166,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);

    // Don't process EndFrame() multiple times.
    if (g.FrameCountEnded == g.FrameCount)
        return;
    IM_ASSERT(g.WithinFrameScope && "Forgot to call ImGui::NewFrame()?");

    CallContextHooks(&g, ImGuiContextHookType_EndFramePre);

    ErrorCheckEndFrameSanityChecks();

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.WithinFrameScopeWithImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Update navigation: CTRL+Tab, wrap-around requests
    NavEndFrame();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
    {
        g.DragDropWithinSource = true;
        SetTooltip("...");
        g.DragDropWithinSource = false;
    }

    // End frame
    g.WithinFrameScope = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because children may not exist yet
    g.WindowsTempSortBuffer.resize(0);
    g.WindowsTempSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsTempSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsTempSortBuffer.Size);
    g.Windows.swap(g.WindowsTempSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));

    CallContextHooks(&g, ImGuiContextHookType_EndFramePost);
}